

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd_test.cpp
# Opt level: O0

void __thiscall Optional_RunDestructors_Test::TestBody(Optional_RunDestructors_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  AssertHelper *this_00;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  optional<AliveCounter> opt2_1;
  AssertionResult gtest_ar_11;
  AliveCounter ac2_1;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AliveCounter ac2;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  optional<AliveCounter> opt2;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  optional<AliveCounter> opt;
  AliveCounter *in_stack_fffffffffffffc58;
  optional<AliveCounter> *in_stack_fffffffffffffc60;
  undefined7 in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffc6f;
  char *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc78;
  int in_stack_fffffffffffffc7c;
  int line;
  char *in_stack_fffffffffffffc80;
  Type in_stack_fffffffffffffc8c;
  Type type;
  AssertHelper *in_stack_fffffffffffffc90;
  undefined7 in_stack_fffffffffffffcd8;
  undefined1 in_stack_fffffffffffffcdf;
  AssertHelper *in_stack_fffffffffffffce0;
  AssertionResult local_290 [2];
  undefined4 local_26c;
  AssertionResult local_268 [2];
  undefined4 local_244;
  AssertionResult local_240 [2];
  undefined4 local_214;
  AssertionResult local_210;
  AliveCounter local_1f9 [21];
  undefined4 local_1e4;
  AssertionResult local_1e0 [2];
  undefined4 local_1bc;
  AssertionResult local_1b8 [2];
  undefined4 local_194;
  AssertionResult local_190 [2];
  undefined4 local_16c;
  AssertionResult local_168 [2];
  undefined4 local_144;
  AssertionResult local_140;
  AliveCounter local_129 [21];
  undefined4 local_114;
  AssertionResult local_110 [2];
  undefined4 local_ec;
  AssertionResult local_e8;
  AliveCounter local_d3 [23];
  undefined4 local_bc;
  AssertionResult local_b8 [2];
  undefined4 local_94;
  AssertionResult local_90;
  AliveCounter local_79 [21];
  undefined4 local_64;
  AssertionResult local_60;
  AliveCounter local_49 [37];
  undefined4 local_24;
  AssertionResult local_20;
  optional<AliveCounter> local_a [5];
  
  AliveCounter::nAlive = 0;
  pstd::optional<AliveCounter>::optional(local_a);
  local_24 = 0;
  testing::internal::EqHelper<true>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70,
             (int *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
             (int *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc90);
    testing::AssertionResult::failure_message((AssertionResult *)0x622ed8);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,in_stack_fffffffffffffc80,
               in_stack_fffffffffffffc7c,in_stack_fffffffffffffc70);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffce0,
               (Message *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc60);
    testing::Message::~Message((Message *)0x622f3b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x622f93);
  AliveCounter::AliveCounter(local_49);
  pstd::optional<AliveCounter>::operator=(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  AliveCounter::~AliveCounter(local_49);
  local_64 = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70,
             (int *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
             (int *)in_stack_fffffffffffffc60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc90);
    testing::AssertionResult::failure_message((AssertionResult *)0x623092);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,in_stack_fffffffffffffc80,
               in_stack_fffffffffffffc7c,in_stack_fffffffffffffc70);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffce0,
               (Message *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc60);
    testing::Message::~Message((Message *)0x6230f5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x62314d);
  AliveCounter::AliveCounter(local_79);
  pstd::optional<AliveCounter>::operator=(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  AliveCounter::~AliveCounter(local_79);
  local_94 = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70,
             (int *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
             (int *)in_stack_fffffffffffffc60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_90);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc90);
    testing::AssertionResult::failure_message((AssertionResult *)0x62324c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,in_stack_fffffffffffffc80,
               in_stack_fffffffffffffc7c,in_stack_fffffffffffffc70);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffce0,
               (Message *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc60);
    testing::Message::~Message((Message *)0x6232af);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x623307);
  pstd::optional<AliveCounter>::reset(in_stack_fffffffffffffc60);
  local_bc = 0;
  testing::internal::EqHelper<true>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70,
             (int *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
             (int *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc90);
    testing::AssertionResult::failure_message((AssertionResult *)0x6233c1);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,in_stack_fffffffffffffc80,
               in_stack_fffffffffffffc7c,in_stack_fffffffffffffc70);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffce0,
               (Message *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc60);
    testing::Message::~Message((Message *)0x623424);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x62347c);
  AliveCounter::AliveCounter(local_d3);
  pstd::optional<AliveCounter>::optional(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  AliveCounter::~AliveCounter(local_d3);
  local_ec = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70,
             (int *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
             (int *)in_stack_fffffffffffffc60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc90);
    testing::AssertionResult::failure_message((AssertionResult *)0x623594);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,in_stack_fffffffffffffc80,
               in_stack_fffffffffffffc7c,in_stack_fffffffffffffc70);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffce0,
               (Message *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc60);
    testing::Message::~Message((Message *)0x6235f7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x62364c);
  pstd::optional<AliveCounter>::~optional((optional<AliveCounter> *)0x623659);
  local_114 = 0;
  testing::internal::EqHelper<true>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70,
             (int *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
             (int *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_110);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc90);
    testing::AssertionResult::failure_message((AssertionResult *)0x623711);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,in_stack_fffffffffffffc80,
               in_stack_fffffffffffffc7c,in_stack_fffffffffffffc70);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffce0,
               (Message *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc60);
    testing::Message::~Message((Message *)0x623774);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x6237c9);
  AliveCounter::AliveCounter(local_129);
  local_144 = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70,
             (int *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
             (int *)in_stack_fffffffffffffc60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_140);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc90);
    in_stack_fffffffffffffce0 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x623897);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,in_stack_fffffffffffffc80,
               in_stack_fffffffffffffc7c,in_stack_fffffffffffffc70);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffce0,
               (Message *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc60);
    testing::Message::~Message((Message *)0x6238fa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x62394f);
  pstd::optional<AliveCounter>::reset(in_stack_fffffffffffffc60);
  local_16c = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70,
             (int *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
             (int *)in_stack_fffffffffffffc60);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_168);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc90);
    testing::AssertionResult::failure_message((AssertionResult *)0x623a04);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,in_stack_fffffffffffffc80,
               in_stack_fffffffffffffc7c,in_stack_fffffffffffffc70);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffce0,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffcd8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc60);
    testing::Message::~Message((Message *)0x623a61);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x623ab6);
  pstd::optional<AliveCounter>::operator=(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  local_194 = 2;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70,
             (int *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
             (int *)in_stack_fffffffffffffc60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_190);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc90);
    testing::AssertionResult::failure_message((AssertionResult *)0x623b6d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,in_stack_fffffffffffffc80,
               in_stack_fffffffffffffc7c,in_stack_fffffffffffffc70);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffce0,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffcd8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc60);
    testing::Message::~Message((Message *)0x623bca);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x623c1f);
  AliveCounter::~AliveCounter(local_129);
  local_1bc = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70,
             (int *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
             (int *)in_stack_fffffffffffffc60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc90);
    testing::AssertionResult::failure_message((AssertionResult *)0x623cd9);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,in_stack_fffffffffffffc80,
               in_stack_fffffffffffffc7c,in_stack_fffffffffffffc70);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffce0,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffcd8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc60);
    testing::Message::~Message((Message *)0x623d36);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x623d8b);
  pstd::optional<AliveCounter>::reset(in_stack_fffffffffffffc60);
  local_1e4 = 0;
  testing::internal::EqHelper<true>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70,
             (int *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
             (int *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc90);
    testing::AssertionResult::failure_message((AssertionResult *)0x623e3f);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,in_stack_fffffffffffffc80,
               in_stack_fffffffffffffc7c,in_stack_fffffffffffffc70);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffce0,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffcd8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc60);
    testing::Message::~Message((Message *)0x623e9c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x623ef1);
  AliveCounter::AliveCounter(local_1f9);
  local_214 = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70,
             (int *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
             (int *)in_stack_fffffffffffffc60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_210);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc90);
    in_stack_fffffffffffffc90 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x623fb9);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,in_stack_fffffffffffffc80,
               in_stack_fffffffffffffc7c,in_stack_fffffffffffffc70);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffce0,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffcd8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc60);
    testing::Message::~Message((Message *)0x624016);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x62406b);
  pstd::optional<AliveCounter>::optional(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  local_244 = 2;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70,
             (int *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
             (int *)in_stack_fffffffffffffc60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_240);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc8c);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc90);
    in_stack_fffffffffffffc80 =
         testing::AssertionResult::failure_message((AssertionResult *)0x62413b);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc90,type,in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,
               in_stack_fffffffffffffc70);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffce0,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffcd8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc60);
    testing::Message::~Message((Message *)0x624198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x6241ed);
  pstd::optional<AliveCounter>::reset(in_stack_fffffffffffffc60);
  local_26c = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70,
             (int *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
             (int *)in_stack_fffffffffffffc60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_268);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc7c);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc90);
    in_stack_fffffffffffffc70 =
         testing::AssertionResult::failure_message((AssertionResult *)0x62429c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc90,type,in_stack_fffffffffffffc80,line,
               in_stack_fffffffffffffc70);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffce0,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffcd8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc60);
    testing::Message::~Message((Message *)0x6242f9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x624351);
  pstd::optional<AliveCounter>::~optional((optional<AliveCounter> *)0x62435e);
  AliveCounter::~AliveCounter(local_1f9);
  testing::internal::EqHelper<true>::Compare<int,int>
            ((char *)CONCAT44(line,in_stack_fffffffffffffc78),in_stack_fffffffffffffc70,
             (int *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),
             (int *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_290);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc90);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x62442a)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc90,type,in_stack_fffffffffffffc80,line,
               in_stack_fffffffffffffc70);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffce0,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffcd8));
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x624487);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x6244dc);
  pstd::optional<AliveCounter>::~optional((optional<AliveCounter> *)0x6244e9);
  return;
}

Assistant:

TEST(Optional, RunDestructors) {
    AliveCounter::nAlive = 0;

    pstd::optional<AliveCounter> opt;
    EXPECT_EQ(0, AliveCounter::nAlive);

    opt = AliveCounter();
    EXPECT_EQ(1, AliveCounter::nAlive);

    opt = AliveCounter();
    EXPECT_EQ(1, AliveCounter::nAlive);

    opt.reset();
    EXPECT_EQ(0, AliveCounter::nAlive);

    {
        pstd::optional<AliveCounter> opt2 = AliveCounter();
        EXPECT_EQ(1, AliveCounter::nAlive);
    }
    EXPECT_EQ(0, AliveCounter::nAlive);

    {
        AliveCounter ac2;
        EXPECT_EQ(1, AliveCounter::nAlive);

        opt.reset();
        EXPECT_EQ(1, AliveCounter::nAlive);

        opt = std::move(ac2);
        EXPECT_EQ(2, AliveCounter::nAlive);
    }
    EXPECT_EQ(1, AliveCounter::nAlive);

    opt.reset();
    EXPECT_EQ(0, AliveCounter::nAlive);

    {
        AliveCounter ac2;
        EXPECT_EQ(1, AliveCounter::nAlive);
        pstd::optional<AliveCounter> opt2(std::move(ac2));
        EXPECT_EQ(2, AliveCounter::nAlive);

        opt2.reset();
        EXPECT_EQ(1, AliveCounter::nAlive);
    }
    EXPECT_EQ(0, AliveCounter::nAlive);
}